

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
* __thiscall
kratos::GeneratorGraph::get_leveled_nodes
          (vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
           *__return_storage_ptr__,GeneratorGraph *this)

{
  Generator *pGVar1;
  size_t sVar2;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  *pvVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  size_type *psVar7;
  uint uVar8;
  shared_ptr<kratos::Generator> *child_generator;
  Generator *pGVar9;
  undefined1 local_100 [8];
  queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
  queue;
  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
  level_index;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_68;
  ulong local_50;
  GeneratorGraph *local_48;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  *local_40;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  *result;
  
  local_40 = __return_storage_ptr__;
  std::
  queue<std::pair<kratos::Generator*,unsigned_int>,std::deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>>
  ::
  queue<std::deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>,void>
            ((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
              *)local_100);
  queue.c.
  super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&level_index._M_h._M_rehash_policy._M_next_resize;
  level_index._M_h._M_buckets = (__buckets_ptr)0x1;
  level_index._M_h._M_bucket_count = 0;
  level_index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  level_index._M_h._M_element_count._0_4_ = 0x3f800000;
  level_index._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  level_index._M_h._M_rehash_policy._4_4_ = 0;
  level_index._M_h._M_rehash_policy._M_next_resize = 0;
  local_68.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this->root_;
  local_68.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_48 = this;
  std::
  deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
  ::emplace_back<std::pair<kratos::Generator*,unsigned_int>>
            ((deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
              *)local_100,(pair<kratos::Generator_*,_unsigned_int> *)&local_68);
  uVar6 = 0;
  do {
    pvVar3 = local_40;
    sVar2 = queue.c.
            super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    if (queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
        (_Map_pointer)
        queue.c.
        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size) {
      (local_40->
      super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_40->
      super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_40->
      super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
      ::resize(local_40,(ulong)((int)uVar6 + 1));
      psVar7 = &level_index._M_h._M_bucket_count;
      while (psVar7 = (size_type *)*psVar7, psVar7 != (size_type *)0x0) {
        std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
        emplace_back<kratos::Generator*&>
                  ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
                   ((pvVar3->
                    super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + (uint)psVar7[2]),
                   (Generator **)(((__node_base *)(psVar7 + 1))->_M_nxt + 1));
      }
      std::
      _Hashtable<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&queue.c.
                        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::
      _Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
      ::~_Deque_base((_Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                      *)local_100);
      return pvVar3;
    }
    std::
    deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
    ::pop_front((deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                 *)local_100);
    result = (vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
              *)get_node(local_48,*(Generator **)sVar2);
    iVar4 = std::
            _Hashtable<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&queue.c.
                       super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node,(key_type *)&result);
    if (iVar4.
        super__Node_iterator_base<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      uVar8 = *(uint *)(sVar2 + 8);
LAB_0019a53d:
      pmVar5 = std::__detail::
               _Map_base<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&queue.c.
                                super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node,
                            (key_type *)&result);
      *pmVar5 = uVar8;
    }
    else {
      pmVar5 = std::__detail::
               _Map_base<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<kratos::GeneratorNode_*,_std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&queue.c.
                        super__Deque_base<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node,(key_type *)&result);
      uVar8 = *(uint *)(sVar2 + 8);
      if (*pmVar5 < uVar8) goto LAB_0019a53d;
    }
    local_50 = uVar6;
    Generator::get_child_generators(&local_68,*(Generator **)sVar2);
    pGVar1 = (Generator *)
             CONCAT44(local_68.
                      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (uint)local_68.
                            super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    for (pGVar9 = (Generator *)
                  local_68.
                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pGVar9 != pGVar1;
        pGVar9 = (Generator *)
                 &(pGVar9->super_IRNode).fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      level_index._M_h._M_single_bucket = (__node_base_ptr)(pGVar9->super_IRNode)._vptr_IRNode;
      std::
      deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
      ::emplace_back<std::pair<kratos::Generator*,unsigned_int>>
                ((deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>
                  *)local_100,
                 (pair<kratos::Generator_*,_unsigned_int> *)&level_index._M_h._M_single_bucket);
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector(&local_68);
    uVar6 = local_50 & 0xffffffff;
    if ((uint)local_50 < *(uint *)(sVar2 + 8)) {
      uVar6 = (ulong)*(uint *)(sVar2 + 8);
    }
  } while( true );
}

Assistant:

std::vector<std::vector<Generator *>> GeneratorGraph::get_leveled_nodes() {
    // this is a modified breath-first search
    std::queue<std::pair<Generator *, uint32_t>> queue;
    std::unordered_map<GeneratorNode *, uint32_t> level_index;

    queue.push({root_, 0});
    uint32_t max_level = 0;

    while (!queue.empty()) {
        const auto &[generator, current_level] = queue.front();
        queue.pop();
        auto const &node = get_node(generator);
        if (level_index.find(node) == level_index.end() || level_index.at(node) < current_level) {
            // update the new level
            level_index[node] = current_level;
        }
        // loop through all the child generators
        for (const auto &child_generator : generator->get_child_generators()) {
            queue.push({child_generator.get(), current_level + 1});
        }
        if (current_level > max_level) max_level = current_level;
    }

    // construct the result
    std::vector<std::vector<Generator *>> result;
    // notice that max is exclusive
    result.resize(max_level + 1);
    for (auto const &[generator_node, level] : level_index) {
        result[level].emplace_back(generator_node->generator);
    }
    return result;
}